

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explain_statement.cpp
# Opt level: O3

string * __thiscall
duckdb::ExplainStatement::OptionsToString_abi_cxx11_
          (string *__return_storage_ptr__,ExplainStatement *this)

{
  char *pcVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  allocator local_81;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  string local_60;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->explain_type == EXPLAIN_ANALYZE) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    sVar2 = __return_storage_ptr__->_M_string_length;
    if (this->explain_format == DEFAULT) goto LAB_01254c86;
    if (sVar2 == 0) goto LAB_01254bdb;
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    if (this->explain_format == DEFAULT) {
      return __return_storage_ptr__;
    }
LAB_01254bdb:
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  local_80[0] = local_70;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"FORMAT %s","");
  pcVar1 = EnumUtil::ToChars<duckdb::ExplainFormat>(this->explain_format);
  ::std::__cxx11::string::string((string *)&local_40,pcVar1,&local_81);
  StringUtil::Format<std::__cxx11::string>(&local_60,(StringUtil *)local_80,&local_40,in_RCX);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  sVar2 = __return_storage_ptr__->_M_string_length;
LAB_01254c86:
  if (sVar2 != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string ExplainStatement::OptionsToString() const {
	string options;
	if (explain_type == ExplainType::EXPLAIN_ANALYZE) {
		options += "(";
		options += "ANALYZE";
	}
	if (explain_format != ExplainFormat::DEFAULT) {
		if (options.empty()) {
			options += "(";
		} else {
			options += ", ";
		}
		options += StringUtil::Format("FORMAT %s", EnumUtil::ToString(explain_format));
	}
	if (!options.empty()) {
		options += ")";
	}
	return options;
}